

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TailVerifying.hpp
# Opt level: O3

void __thiscall
njoy::ENDFtk::record::
TailVerification<0,njoy::ENDFtk::record::TailVerification<1,njoy::ENDFtk::record::TailVerification<2,njoy::ENDFtk::record::Tail>>>
::
TailVerification<int&,int&,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>const&,long&>
          (TailVerification<0,njoy::ENDFtk::record::TailVerification<1,njoy::ENDFtk::record::TailVerification<2,njoy::ENDFtk::record::Tail>>>
           *this,int expectedValue,int *args,int *args_1,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *args_2,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *args_3,long *args_4)

{
  undefined4 *puVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  TailVerification<1,njoy::ENDFtk::record::TailVerification<2,njoy::ENDFtk::record::Tail>>::
  TailVerification<int&,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>const&,long&>
            ((TailVerification<1,njoy::ENDFtk::record::TailVerification<2,njoy::ENDFtk::record::Tail>>
              *)this,*args,args_1,args_2,args_3,args_4);
  if (*(int *)this == expectedValue) {
    return;
  }
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,helper::name<0>,DAT_001d2ba0 + helper::name<0>);
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,helper::symbol<0>,DAT_001d2bc8 + helper::symbol<0>);
  tools::Log::error<char_const*,std::__cxx11::string,std::__cxx11::string>
            ("The record {} number ({}) is inconsistent with expectation.",&local_80,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,helper::name<0>,DAT_001d2ba0 + helper::name<0>);
  tools::Log::info<char_const*,std::__cxx11::string,int>
            ("The read {} number is: {}",&local_60,*(int *)this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,helper::name<0>,DAT_001d2ba0 + helper::name<0>);
  tools::Log::info<char_const*,std::__cxx11::string,int>
            ("The expected {} number is: {}",&local_40,expectedValue);
  std::__cxx11::string::~string((string *)&local_40);
  tools::Log::info<char_const*>("Error encountered while verifying record tail values");
  puVar1 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar1 = 6;
  __cxa_throw(puVar1,&int::typeinfo,0);
}

Assistant:

TailVerification( int expectedValue, Args&&... args ) :
      Tail( std::forward< Args >( args )... ) {
      if( this->fields[ position ] != expectedValue ){
        Log::error( "The record {} number ({}) is inconsistent with expectation.",
                    helper::name< position >, helper::symbol< position > );
        Log::info( "The read {} number is: {}",
                   helper::name< position >, this->fields[ position ] );
        Log::info( "The expected {} number is: {}",
                   helper::name< position >, expectedValue );
        Log::info( "Error encountered while verifying record tail values" );

        throw (position + 6);
      }
    }